

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::resolver::async_resolve
          (resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  *this_00;
  _Any_data *__s;
  long lVar1;
  long lVar2;
  size_t sVar3;
  io_context *piVar4;
  pointer paVar5;
  bool bVar6;
  resolver *prVar7;
  string *__k;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  char *pcVar12;
  iterator iVar13;
  time_point tVar14;
  iterator iVar15;
  iterator __position;
  long *plVar16;
  undefined7 in_register_00000011;
  in_addr_t iVar17;
  _Any_data *__cp;
  ulong uVar18;
  undefined8 uVar19;
  anon_enum_32 aVar20;
  uint uVar21;
  size_t __n;
  bool bVar22;
  bool bVar23;
  string_view host_00;
  string_view host_01;
  string_view service;
  string_view service_00;
  bytes_type bytes;
  char src_buf [64];
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  error_code error_code;
  ptr local_100;
  _Any_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ulong local_c8;
  error_category *peStack_c0;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_b8;
  ulong local_a0;
  callback_t *local_98;
  undefined1 local_90 [12];
  uint local_84;
  pointer local_80;
  uint local_74;
  resolver *local_70;
  io_context *local_68;
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  pointer paStack_50;
  uint *local_40;
  string *local_38;
  
  local_74 = (uint)CONCAT71(in_register_00000011,flags.m_val);
  __s = (_Any_data *)(host->_M_dataplus)._M_p;
  local_98 = h;
  local_70 = this;
  puVar11 = (uint *)__errno_location();
  *puVar11 = 0;
  pcVar12 = strchr(__s->_M_pod_data,0x25);
  __cp = __s;
  local_40 = puVar11;
  local_38 = host;
  if (pcVar12 != (char *)0x0) {
    __n = (long)pcVar12 - (long)__s;
    if (0x3f < (long)__n) {
      uVar18 = 0;
      bVar22 = true;
      uVar21 = 0x16;
      iVar10 = 0;
      goto LAB_002a7ed9;
    }
    __cp = &local_e8;
    memcpy(__cp,__s,__n);
    local_e8._M_pod_data[__n] = '\0';
  }
  iVar10 = inet_pton(10,__cp->_M_pod_data,&local_100);
  bVar22 = *puVar11 != 0;
  uVar21 = 0x16;
  if (iVar10 >= 1 || bVar22) {
    uVar21 = *puVar11;
  }
  bVar22 = iVar10 < 1 && !bVar22 || bVar22;
  if ((iVar10 < 1) || (pcVar12 == (char *)0x0)) {
    uVar18 = 0;
  }
  else {
    if (((local_100.a._1_1_ & 0xc0) == 0x80 && (char)local_100.a == -2) ||
       ((local_100.a._1_1_ & 0xf) == 2 && (char)local_100.a == -1)) {
      uVar8 = if_nametoindex(pcVar12 + 1);
      uVar18 = (ulong)uVar8;
    }
    else {
      uVar18 = 0;
    }
    if (uVar18 == 0) {
      iVar9 = atoi(pcVar12 + 1);
      uVar18 = (ulong)iVar9;
    }
  }
LAB_002a7ed9:
  puVar11 = local_40;
  if (iVar10 < 1) {
    local_e8._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_e8._8_8_ = 0;
    uVar18 = 0;
  }
  else {
    local_e8._M_unused._M_member_pointer = (offset_in__Undefined_class_to_subr)local_100.a;
    local_e8._8_8_ = local_100.v;
  }
  if (bVar22) {
    *local_40 = 0;
    iVar10 = inet_pton(2,__s->_M_pod_data,&local_100);
    bVar23 = *puVar11 != 0;
    bVar6 = iVar10 < 1;
    uVar21 = 0x16;
    if (!bVar6 || bVar23) {
      uVar21 = *puVar11;
    }
    bVar22 = bVar6 && !bVar23 || bVar23;
    if (bVar6 && !bVar23 || bVar23) {
      iVar17 = 0;
    }
    else {
      iVar17 = (in_addr_t)local_100.a;
      if (iVar10 < 1) {
        iVar17 = 0;
      }
    }
    paStack_50 = (pointer)0x0;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    uVar18 = 0;
    aVar20 = ipv4;
  }
  else {
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8._M_unused._0_8_;
    paStack_50 = (pointer)local_e8._8_8_;
    aVar20 = ipv6;
    iVar17 = 0;
  }
  __k = local_38;
  prVar7 = local_70;
  if (!bVar22) {
    paVar5 = (pointer)local_70->m_ios;
    ::std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)&local_e8,local_98);
    local_c8 = (ulong)uVar21;
    peStack_c0 = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = paStack_50;
    local_100.a = (allocator<void> *)(local_90 + 8);
    local_84 = 1;
    local_a0 = uVar18;
    local_90._0_8_ = paVar5;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = aVar20;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = iVar17;
    plVar16 = (long *)__tls_get_addr(&PTR_004faf08);
    if (*plVar16 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = *(undefined8 *)(*plVar16 + 8);
    }
    local_100.v = boost::asio::detail::thread_info_base::
                  allocate<boost::asio::detail::thread_info_base::default_tag>(uVar19,0x70);
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).func_ =
         boost::asio::detail::
         executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         ::do_complete;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).task_result_ = 0;
    *(undefined8 *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_functor = 0;
    *(undefined8 *)
     ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).h._M_invoker = (_Invoker_type)local_d8._8_8_;
    if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
      *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_100.v)->handler_).h.super__Function_base._M_functor =
           local_e8._M_unused._M_object;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = local_e8._8_8_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_manager =
           (_Manager_type)local_d8._M_allocated_capacity;
      local_d8._M_allocated_capacity = 0;
      local_d8._8_8_ = (_Invoker_type)0x0;
    }
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.val_ = (undefined4)local_c8;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.failed_ = (bool)local_c8._4_1_;
    *(undefined3 *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ec.field_0x5 = local_c8._5_3_;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.cat_ = peStack_c0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ip.type_ =
         (anon_enum_32)
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ip.ipv4_address_.addr_.s_addr =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    *(pointer *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ip.ipv6_address_.addr_.__in6_u =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_100.v)->handler_).ip.ipv6_address_.addr_.__in6_u + 8) =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ip.ipv6_address_.scope_id_ = local_a0;
    local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)local_100.v;
    boost::asio::detail::scheduler::post_immediate_completion
              (*(scheduler **)&(((address_v6 *)(local_90._0_8_ + 8))->addr_).__in6_u,
               (operation *)local_100.v,SUB41((local_84 & 2) >> 1,0));
    local_100.v = (void *)0x0;
    local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
    boost::asio::detail::
    executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
    ::ptr::reset(&local_100);
    if ((_Manager_type)local_d8._M_allocated_capacity == (_Manager_type)0x0) {
      return;
    }
    (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
    return;
  }
  iVar13 = ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(local_70->m_cache)._M_h,local_38);
  uVar21 = local_74;
  if ((iVar13.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
       ._M_cur == (__node_type *)0x0) ||
     (((local_74 & 1) == 0 &&
      (lVar1 = (prVar7->m_timeout).__r,
      lVar2 = *(long *)((long)iVar13.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                              ._M_cur + 0x28), tVar14 = time_now(),
      lVar1 + lVar2 < (long)tVar14.__d.__r)))) {
    iVar15 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(prVar7->m_failed_cache)._M_h,__k);
    if ((iVar15.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
         ._M_cur != (__node_type *)0x0) &&
       (((uVar21 & 1) != 0 ||
        (lVar1 = (prVar7->m_timeout).__r,
        lVar2 = *(long *)((long)iVar15.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                                ._M_cur + 0x28), tVar14 = time_now(),
        (long)tVar14.__d.__r <= lVar1 + lVar2)))) {
      local_68 = *(io_context **)
                  ((long)iVar15.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                         ._M_cur + 0x30);
      uStack_60 = *(error_category **)
                   ((long)iVar15.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                          ._M_cur + 0x38);
      paVar5 = (pointer)prVar7->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&local_e8,local_98);
      local_c8 = (ulong)local_68;
      peStack_c0 = uStack_60;
      local_100.a = (allocator<void> *)(local_90 + 8);
      local_84 = 1;
      local_90._0_8_ = paVar5;
      plVar16 = (long *)__tls_get_addr(&PTR_004faf08);
      if (*plVar16 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(undefined8 *)(*plVar16 + 8);
      }
      local_100.v = boost::asio::detail::thread_info_base::
                    allocate<boost::asio::detail::thread_info_base::default_tag>(uVar19,0x50);
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).task_result_ = 0;
      *(undefined8 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_100.v)->handler_).h.super__Function_base._M_functor = 0;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h._M_invoker = (_Invoker_type)local_d8._8_8_;
      if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
        *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_100.v)->handler_).h.super__Function_base._M_functor =
             local_e8._M_unused._M_object;
        *(undefined8 *)
         ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) =
             local_e8._8_8_;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_100.v)->handler_).h.super__Function_base._M_manager =
             (_Manager_type)local_d8._M_allocated_capacity;
        local_d8._M_allocated_capacity = 0;
        local_d8._8_8_ = (_Invoker_type)0x0;
      }
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ec.val_ = (undefined4)local_c8;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ec.failed_ = (bool)local_c8._4_1_;
      *(undefined3 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_100.v)->handler_).ec.field_0x5 = local_c8._5_3_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ec.cat_ = peStack_c0;
      local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                     *)local_100.v;
      boost::asio::detail::scheduler::post_immediate_completion
                (*(scheduler **)&(((address_v6 *)(local_90._0_8_ + 8))->addr_).__in6_u,
                 (operation *)local_100.v,SUB41((local_84 & 2) >> 1,0));
      local_100.v = (void *)0x0;
      local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                     *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_100);
      if ((_Manager_type)local_d8._M_allocated_capacity == (_Manager_type)0x0) {
        return;
      }
      (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
      return;
    }
    if ((uVar21 & 1) != 0) {
      paVar5 = (pointer)prVar7->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&local_e8,local_98);
      local_100.a = (allocator<void> *)(local_90 + 8);
      local_84 = 1;
      local_90._0_8_ = paVar5;
      plVar16 = (long *)__tls_get_addr(&PTR_004faf08);
      if (*plVar16 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(undefined8 *)(*plVar16 + 8);
      }
      local_100.v = boost::asio::detail::thread_info_base::
                    allocate<boost::asio::detail::thread_info_base::default_tag>(uVar19,0x40);
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->super_scheduler_operation).task_result_ = 0;
      *(undefined8 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_100.v)->handler_).h.super__Function_base._M_functor = 0;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h._M_invoker = (_Invoker_type)local_d8._8_8_;
      if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
        *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_100.v)->handler_).h.super__Function_base._M_functor =
             local_e8._M_unused._M_object;
        *(undefined8 *)
         ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) =
             local_e8._8_8_;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_100.v)->handler_).h.super__Function_base._M_manager =
             (_Manager_type)local_d8._M_allocated_capacity;
        local_d8._M_allocated_capacity = 0;
        local_d8._8_8_ = (_Invoker_type)0x0;
      }
      local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                     *)local_100.v;
      boost::asio::detail::scheduler::post_immediate_completion
                (*(scheduler **)&(((address_v6 *)(local_90._0_8_ + 8))->addr_).__in6_u,
                 (operation *)local_100.v,SUB41((local_84 & 2) >> 1,0));
      local_100.v = (void *)0x0;
      local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                     *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_100);
      if ((_Manager_type)local_d8._M_allocated_capacity == (_Manager_type)0x0) {
        return;
      }
      (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
      return;
    }
    this_00 = &prVar7->m_callbacks;
    __position = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
                 ::find(&this_00->_M_t,__k);
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
    ::
    pair<std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                *)&local_e8,__k,local_98);
    local_100.a = (allocator<void> *)this_00;
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
    ::
    _M_insert_equal_<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
                *)this_00,(const_iterator)__position._M_node,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                *)&local_e8,(_Alloc_node *)&local_100);
    if (local_b8.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)local_b8.
                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                ._M_impl.super__Vector_impl_data._M_start)(&local_c8,&local_c8,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_unused._0_8_ != &local_d8) {
      operator_delete(local_e8._M_unused._M_object,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if ((_Rb_tree_header *)__position._M_node !=
        &(prVar7->m_callbacks)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    pcVar12 = (__k->_M_dataplus)._M_p;
    sVar3 = __k->_M_string_length;
    if ((uVar21 & 2) == 0) {
      local_e8._M_unused._M_object = on_lookup;
      local_e8._8_8_ = 0;
      local_d8._M_allocated_capacity = (size_type)&local_c8;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar12,pcVar12 + sVar3);
      local_b8.
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)prVar7;
      host_00._M_str = pcVar12;
      host_00._M_len = sVar3;
      service._M_str = "80";
      service._M_len = 2;
      boost::asio::ip::
      basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&prVar7->m_critical_resolver,host_00,service,0,
                 (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_e8);
    }
    else {
      local_e8._M_unused._M_object = on_lookup;
      local_e8._8_8_ = 0;
      local_d8._M_allocated_capacity = (size_type)&local_c8;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar12,pcVar12 + sVar3);
      local_b8.
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)prVar7;
      host_01._M_str = pcVar12;
      host_01._M_len = sVar3;
      service_00._M_str = "80";
      service_00._M_len = 2;
      boost::asio::ip::
      basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&prVar7->m_resolver,host_01,service_00,0,
                 (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_e8);
    }
    if ((ulong *)local_d8._M_allocated_capacity == &local_c8) {
      return;
    }
    uVar18 = local_c8 + 1;
    local_90._0_8_ = local_d8._M_allocated_capacity;
  }
  else {
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               local_90,(vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                         *)((long)iVar13.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                                  ._M_cur + 0x30));
    piVar4 = prVar7->m_ios;
    ::std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)&local_e8,local_98);
    local_c8 = 0;
    peStack_c0 = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              (&local_b8,
               (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               local_90);
    local_100.a = (allocator<void> *)&uStack_60;
    uStack_60 = (error_category *)CONCAT44(1,(undefined4)uStack_60);
    local_68 = piVar4;
    plVar16 = (long *)__tls_get_addr(&PTR_004faf08);
    if (*plVar16 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = *(undefined8 *)(*plVar16 + 8);
    }
    local_100.v = boost::asio::detail::thread_info_base::
                  allocate<boost::asio::detail::thread_info_base::default_tag>(uVar19,0x68);
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).func_ =
         boost::asio::detail::
         executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         ::do_complete;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->super_scheduler_operation).task_result_ = 0;
    *(undefined8 *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_functor = 0;
    *(undefined8 *)
     ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).h._M_invoker = (_Invoker_type)local_d8._8_8_;
    if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
      *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_100.v)->handler_).h.super__Function_base._M_functor =
           local_e8._M_unused._M_object;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_100.v)->handler_).h.super__Function_base._M_functor + 8) = local_e8._8_8_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).h.super__Function_base._M_manager =
           (_Manager_type)local_d8._M_allocated_capacity;
      local_d8._M_allocated_capacity = 0;
      local_d8._8_8_ = (_Invoker_type)0x0;
    }
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.val_ = (undefined4)local_c8;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.failed_ = (bool)local_c8._4_1_;
    *(undefined3 *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ec.field_0x5 = local_c8._5_3_;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_100.v)->handler_).ec.cat_ = peStack_c0;
    *(pointer *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ip.type_ =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_100.v)->handler_).ip.ipv6_address_.addr_.__in6_u =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_100.v)->handler_).ip.ipv6_address_.addr_.__in6_u + 8) =
         local_b8.
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)local_100.v;
    boost::asio::detail::scheduler::post_immediate_completion
              (local_68->impl_,(operation *)local_100.v,SUB41((uStack_60._4_4_ & 2) >> 1,0));
    local_100.v = (void *)0x0;
    local_100.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
    boost::asio::detail::
    executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
    ::ptr::reset((ptr *)&local_100);
    if ((resolver *)
        local_b8.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start != (resolver *)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
      (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
    }
    if ((pointer)local_90._0_8_ == (pointer)0x0) {
      return;
    }
    uVar18 = (long)local_80 - local_90._0_8_;
  }
  operator_delete((void *)local_90._0_8_,uVar18);
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			post(m_ios, [h, ec, ip]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= time_now())
			{
				std::vector<address> ips = i->second.addresses;
				post(m_ios, [h, ec, ips] { callback(h, ec, ips); });
				return;
			}
		}

		auto const k = m_failed_cache.find(host);
		if (k != m_failed_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| k->second.last_seen + m_timeout >= time_now())
			{
				error_code error_code = k->second.error;
				post(m_ios, [h, error_code] { callback(h, error_code, {}); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			post(m_ios, [h] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		auto iter = m_callbacks.find(host);
		bool const done = (iter != m_callbacks.end());

		m_callbacks.insert(iter, {host, std::move(h)});

		// if there is an existing outtanding lookup, our callback will be
		// called once it completes. We're done here.
		if (done) return;

		// the port is ignored
		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
		else
		{
			m_critical_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
	}